

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<spirv_cross::SPIRString&>
          (ObjectPool<spirv_cross::SPIRString> *this,SPIRString *p)

{
  Vector<spirv_cross::SPIRString_*> *this_00;
  pointer pcVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
  _Var2;
  _Head_base<0UL,_spirv_cross::SPIRString_*,_false> _Var3;
  size_t sVar4;
  ulong uVar5;
  SPIRString *pSVar6;
  
  this_00 = &this->vacants;
  sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
  if (sVar4 == 0) {
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            .buffer_size;
    uVar5 = (ulong)(this->start_object_count << ((byte)sVar4 & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRString_*,_false>)malloc(uVar5 * 0x30);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl ==
        (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    if (uVar5 != 0) {
      sVar4 = 0;
      _Var3._M_head_impl =
           (SPIRString *)_Var2.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRString_*,_0UL>::reserve(this_00,sVar4 + 1);
        sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar4] = _Var3._M_head_impl;
        sVar4 = sVar4 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size = sVar4;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      sVar4 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar4 + 1);
    sVar4 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
    .ptr[sVar4]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRString_*,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRString_*,_false> =
         _Var2.super__Head_base<0UL,_spirv_cross::SPIRString_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
    .buffer_size = sVar4 + 1;
    sVar4 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.buffer_size;
    pSVar6 = (this->vacants).super_VectorView<spirv_cross::SPIRString_*>.ptr[sVar4 - 1];
    if (sVar4 == 0) goto LAB_002c9692;
  }
  else {
    pSVar6 = (this_00->super_VectorView<spirv_cross::SPIRString_*>).ptr[sVar4 - 1];
  }
  SmallVector<spirv_cross::SPIRString_*,_0UL>::resize(this_00,sVar4 - 1);
LAB_002c9692:
  (pSVar6->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar6->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRString_00358890;
  (pSVar6->str)._M_dataplus._M_p = (pointer)&(pSVar6->str).field_2;
  pcVar1 = (p->str)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar6->str,pcVar1,pcVar1 + (p->str)._M_string_length);
  return pSVar6;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}